

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O1

void sshproxy_logging_error(LogPolicy *lp,char *event)

{
  char *event_00;
  
  if (lp[-0x411].vt != (LogPolicyVtable *)0x0) {
    (**(code **)((lp[-0x411].vt)->eventlog + 0x10))();
    return;
  }
  event_00 = dupprintf("Logging error: %s");
  sshproxy_eventlog(lp,event_00);
  safefree(event_00);
  return;
}

Assistant:

static void sshproxy_logging_error(LogPolicy *lp, const char *event)
{
    SshProxy *sp = container_of(lp, SshProxy, logpolicy);

    /*
     * If we have access to the outer LogPolicy, pass on this request
     * to it.
     */
    if (sp->clientlp) {
        lp_logging_error(sp->clientlp, event);
        return;
    }

    /*
     * Otherwise, the best we can do is to put it in the outer SSH
     * connection's Event Log.
     */
    char *msg = dupprintf("Logging error: %s", event);
    sshproxy_eventlog(lp, msg);
    sfree(msg);
}